

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O3

void __thiscall CCDPP_MPI::~CCDPP_MPI(CCDPP_MPI *this)

{
  pool *ppVar1;
  pointer pRVar2;
  
  ppVar1 = this->thread_pool;
  if (ppVar1 != (pool *)0x0) {
    boost::detail::shared_count::~shared_count(&(ppVar1->m_shutdown_controller).pn);
    boost::detail::shared_count::~shared_count(&(ppVar1->m_core).pn);
  }
  operator_delete(ppVar1);
  if (this->Q != (value_type_conflict1 *)0x0) {
    operator_delete__(this->Q);
  }
  if (this->P != (value_type_conflict1 *)0x0) {
    operator_delete__(this->P);
  }
  if (this->parameter->verbose == true) {
    if (this->entire_Q != (value_type_conflict1 *)0x0) {
      operator_delete__(this->entire_Q);
    }
    if (this->entire_P != (value_type_conflict1 *)0x0) {
      operator_delete__(this->entire_P);
    }
  }
  MPI_Finalize();
  pRVar2 = (this->test_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2);
  }
  pRVar2 = (this->train_ratings).super__Vector_base<Rating,_std::allocator<Rating>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->item_user_R)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->user_item_R)._M_h);
  return;
}

Assistant:

~CCDPP_MPI(){

        delete thread_pool;
        delete[] Q;
        delete[] P;

        if(parameter->verbose){
            delete[] entire_Q;
            delete[] entire_P;
        }

        MPI_Finalize();
    }